

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O2

void __thiscall Refal2::CArbitraryInteger::Div(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  bool bVar1;
  bool bVar2;
  int __denom;
  
  removeLeadingZeros(this);
  removeLeadingZeros(operand);
  bVar1 = this->isNegative;
  bVar2 = operand->isNegative;
  div(this,(int)operand,__denom);
  this->isNegative = bVar1 != bVar2;
  operand->isNegative = bVar1;
  removeLeadingZeros(this);
  return;
}

Assistant:

void CArbitraryInteger::Div( CArbitraryInteger& operand )
{
	removeLeadingZeros();
	operand.removeLeadingZeros();
	const bool operandSign = IsNegative();
	const bool resultSign = IsNegative() != operand.IsNegative();
	div( operand );
	SetSign( resultSign );
	operand.SetSign( operandSign );
	removeLeadingZeros();
}